

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.h
# Opt level: O3

BSSRDFProbeSegment * __thiscall
pbrt::TabulatedBSSRDF::Sample
          (BSSRDFProbeSegment *__return_storage_ptr__,TabulatedBSSRDF *this,Float u1,Point2f *u2)

{
  float fVar1;
  Float FVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  undefined8 uVar4;
  undefined1 auVar6 [16];
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long in_FS_OFFSET;
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float local_d0 [4];
  float local_c0;
  float local_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  float local_98;
  float local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 extraout_var [60];
  
  lVar8 = 0;
  local_d0[0] = 0.5;
  local_d0[1] = 0.25;
  fVar18 = 0.0;
  local_d0[2] = 0.25;
  do {
    fVar18 = fVar18 + *(float *)((long)local_d0 + lVar8);
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0xc);
  local_a8._0_4_ = fVar18;
  lVar8 = 0;
  do {
    if (u1 < local_d0[lVar8] / fVar18) goto LAB_004662a3;
    u1 = u1 - local_d0[lVar8] / fVar18;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  lVar8 = 3;
LAB_004662a3:
  local_b8._0_4_ = u1;
  if ((SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg == '\0') &&
     (iVar7 = __cxa_guard_acquire(&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg)
     , iVar7 != 0)) {
    StatRegisterer::StatRegisterer
              ((StatRegisterer *)&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg,
               SampleDiscrete(pstd::span<float_const>,float,float*,float*)::
               {lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,(PixelAccumFunc)0x0);
    __cxa_guard_release(&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg);
  }
  *(long *)(in_FS_OFFSET + -0x760) = *(long *)(in_FS_OFFSET + -0x760) + 1;
  if (lVar8 == 3) {
    *(long *)(in_FS_OFFSET + -0x768) = *(long *)(in_FS_OFFSET + -0x768) + 1;
    auVar23 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                         ZEXT416((uint)((float)local_b8._0_4_ /
                                       (local_d0[2] / (float)local_a8._0_4_))));
    fVar18 = auVar23._0_4_;
  }
  else {
    iVar7 = (int)lVar8;
    auVar23 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                         ZEXT416((uint)((float)local_b8._0_4_ /
                                       (local_d0[iVar7] / (float)local_a8._0_4_))));
    fVar18 = auVar23._0_4_;
    if (iVar7 == 0) {
      lVar8 = 0x24;
      lVar9 = 0x20;
      lVar10 = 0x1c;
      lVar11 = 0x3c;
      lVar12 = 0x38;
      lVar13 = 0x34;
      lVar14 = 0x30;
      lVar15 = 0x2c;
      lVar16 = 0x28;
      goto LAB_00466394;
    }
    if (iVar7 != 2) {
      if (iVar7 != 1) {
        LogFatal(Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bssrdf.h"
                 ,0xd2,"Unexpected value returned from SampleDiscrete");
      }
      lVar8 = 0x30;
      lVar9 = 0x2c;
      lVar10 = 0x28;
      lVar11 = 0x24;
      lVar12 = 0x20;
      lVar13 = 0x1c;
      lVar14 = 0x3c;
      lVar15 = 0x38;
      lVar16 = 0x34;
      goto LAB_00466394;
    }
  }
  lVar8 = 0x3c;
  lVar9 = 0x38;
  lVar10 = 0x34;
  lVar11 = 0x30;
  lVar12 = 0x2c;
  lVar13 = 0x28;
  lVar14 = 0x24;
  lVar15 = 0x20;
  lVar16 = 0x1c;
LAB_00466394:
  fVar1 = *(float *)((long)&(((TabulatedBSSRDF *)(&this->sigma_t + -5))->po).
                            super_Tuple3<pbrt::Point3,_float>.x + lVar14);
  local_38 = ZEXT416(*(uint *)((long)&(((TabulatedBSSRDF *)(&this->sigma_t + -5))->po).
                                      super_Tuple3<pbrt::Point3,_float>.x + lVar15));
  local_58 = ZEXT416(*(uint *)((long)&(((TabulatedBSSRDF *)(&this->sigma_t + -5))->po).
                                      super_Tuple3<pbrt::Point3,_float>.x + lVar16));
  local_c0 = *(float *)((long)&(((TabulatedBSSRDF *)(&this->sigma_t + -5))->po).
                               super_Tuple3<pbrt::Point3,_float>.x + lVar11);
  local_48 = ZEXT416(*(uint *)((long)&(((TabulatedBSSRDF *)(&this->sigma_t + -5))->po).
                                      super_Tuple3<pbrt::Point3,_float>.x + lVar12));
  local_68 = ZEXT416(*(uint *)((long)&(((TabulatedBSSRDF *)(&this->sigma_t + -5))->po).
                                      super_Tuple3<pbrt::Point3,_float>.x + lVar13));
  local_bc = *(float *)((long)&(((TabulatedBSSRDF *)(&this->sigma_t + -5))->po).
                               super_Tuple3<pbrt::Point3,_float>.x + lVar8);
  iVar7 = 3;
  if ((int)(fVar18 * 4.0) < 3) {
    iVar7 = (int)(fVar18 * 4.0);
  }
  local_a8 = ZEXT416(*(uint *)((long)&(((TabulatedBSSRDF *)(&this->sigma_t + -5))->po).
                                      super_Tuple3<pbrt::Point3,_float>.x + lVar9));
  local_b8 = ZEXT416(*(uint *)((long)&(((TabulatedBSSRDF *)(&this->sigma_t + -5))->po).
                                      super_Tuple3<pbrt::Point3,_float>.x + lVar10));
  local_98 = Sample_Sr(this,iVar7,(u2->super_Tuple2<pbrt::Point2,_float>).x);
  if (0.0 <= local_98) {
    fVar18 = (u2->super_Tuple2<pbrt::Point2,_float>).y;
    auVar21._0_4_ = Sample_Sr(this,iVar7,0.999);
    auVar21._4_60_ = extraout_var;
    if (local_98 < auVar21._0_4_) {
      fVar18 = fVar18 * 6.2831855;
      auVar23 = vfmsub213ss_fma(auVar21._0_16_,auVar21._0_16_,ZEXT416((uint)(local_98 * local_98)));
      if (auVar23._0_4_ < 0.0) {
        fVar19 = sqrtf(auVar23._0_4_);
      }
      else {
        auVar23 = vsqrtss_avx(auVar23,auVar23);
        fVar19 = auVar23._0_4_;
      }
      local_78 = ZEXT416((uint)(fVar19 + fVar19));
      local_88 = cosf(fVar18);
      fVar1 = local_88 * fVar1;
      fVar19 = sinf(fVar18);
      fVar18 = local_98 * (fVar19 * local_c0 + fVar1) +
               (this->po).super_Tuple3<pbrt::Point3,_float>.z +
               (float)local_78._0_4_ * local_bc * -0.5;
      auVar23 = vinsertps_avx(local_58,ZEXT416((uint)local_38._0_4_),0x10);
      auVar6 = vinsertps_avx(local_68,ZEXT416((uint)local_48._0_4_),0x10);
      FVar2 = this->time;
      uVar3 = (this->po).super_Tuple3<pbrt::Point3,_float>.x;
      uVar5 = (this->po).super_Tuple3<pbrt::Point3,_float>.y;
      auVar17 = vinsertps_avx(local_b8,ZEXT416((uint)local_a8._0_4_),0x10);
      auVar22._0_4_ = auVar17._0_4_ * (float)local_78._0_4_;
      auVar22._4_4_ = auVar17._4_4_ * (float)local_78._0_4_;
      auVar22._8_4_ = auVar17._8_4_ * (float)local_78._0_4_;
      auVar22._12_4_ = auVar17._12_4_ * (float)local_78._0_4_;
      auVar17._8_4_ = 0xbf000000;
      auVar17._0_8_ = 0xbf000000bf000000;
      auVar17._12_4_ = 0xbf000000;
      auVar17 = vmulps_avx512vl(auVar22,auVar17);
      auVar20._0_4_ =
           (float)uVar3 + local_98 * (auVar23._0_4_ * local_88 + auVar6._0_4_ * fVar19) +
           auVar17._0_4_;
      auVar20._4_4_ =
           (float)uVar5 + local_98 * (auVar23._4_4_ * local_88 + auVar6._4_4_ * fVar19) +
           auVar17._4_4_;
      auVar20._8_4_ =
           local_98 * (auVar23._8_4_ * local_88 + auVar6._8_4_ * fVar19) + 0.0 + auVar17._8_4_;
      auVar20._12_4_ =
           local_98 * (auVar23._12_4_ * local_88 + auVar6._12_4_ * fVar19) + 0.0 + auVar17._12_4_;
      auVar23._0_4_ = auVar22._0_4_ + auVar20._0_4_;
      auVar23._4_4_ = auVar22._4_4_ + auVar20._4_4_;
      auVar23._8_4_ = auVar22._8_4_ + auVar20._8_4_;
      auVar23._12_4_ = auVar22._12_4_ + auVar20._12_4_;
      uVar4 = vmovlps_avx(auVar20);
      (__return_storage_ptr__->p0).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar4;
      (__return_storage_ptr__->p0).super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar4 >> 0x20);
      (__return_storage_ptr__->p0).super_Tuple3<pbrt::Point3,_float>.z = fVar18;
      uVar4 = vmovlps_avx(auVar23);
      (__return_storage_ptr__->p1).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar4;
      (__return_storage_ptr__->p1).super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar4 >> 0x20);
      (__return_storage_ptr__->p1).super_Tuple3<pbrt::Point3,_float>.z =
           (float)local_78._0_4_ * local_bc + fVar18;
      __return_storage_ptr__->time = FVar2;
      __return_storage_ptr__->valid = true;
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->p0).super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  (__return_storage_ptr__->p0).super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->p0).super_Tuple3<pbrt::Point3,_float>.z = 0;
  (__return_storage_ptr__->p1).super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  (__return_storage_ptr__->p1).super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  __return_storage_ptr__->time = 0.0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x1d = 0;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    BSSRDFProbeSegment Sample(Float u1, const Point2f &u2) const {
        // Choose projection axis for BSSRDF sampling
        Vector3f vx, vy, vz;
        switch (SampleDiscrete({0.5, .25, .25}, u1, nullptr, &u1)) {
        case 0:
            vx = ss;
            vy = ts;
            vz = Vector3f(ns);
            break;
        case 1:
            // Prepare for sampling rays with respect to _ss_
            vx = ts;
            vy = Vector3f(ns);
            vz = ss;
            break;

        case 2:
            // Prepare for sampling rays with respect to _ts_
            vx = Vector3f(ns);
            vy = ss;
            vz = ts;
            break;

        default:
            LOG_FATAL("Unexpected value returned from SampleDiscrete");
        }

        // Choose spectral channel for BSSRDF sampling
        int ch = std::min<int>(u1 * NSpectrumSamples, NSpectrumSamples - 1);
        u1 = std::min(u1 * NSpectrumSamples - ch, OneMinusEpsilon);

        // Sample BSSRDF profile in polar coordinates
        Float r = Sample_Sr(ch, u2[0]);
        if (r < 0)
            return {};
        Float phi = 2 * Pi * u2[1];

        // Compute BSSRDF profile bounds and intersection height
        Float rMax = Sample_Sr(ch, 0.999f);
        if (r >= rMax)
            return {};
        Float l = 2 * std::sqrt(rMax * rMax - r * r);

        // Return BSSRDF sampling ray segment
        Point3f pStart =
            po + r * (vx * std::cos(phi) + vy * std::sin(phi)) - l * vz * 0.5f;
        Point3f pTarget = pStart + l * vz;
        return BSSRDFProbeSegment{pStart, pTarget, time};
    }